

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool __thiscall mkvparser::Tags::Tag::ExpandSimpleTagsArray(Tag *this)

{
  SimpleTag *pSVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined8 uVar5;
  bool bVar6;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  SimpleTag *pSVar13;
  
  iVar4 = this->m_simple_tags_size;
  bVar6 = true;
  if (iVar4 <= this->m_simple_tags_count) {
    iVar12 = 1;
    if (iVar4 != 0) {
      iVar12 = iVar4 * 2;
    }
    lVar11 = (long)iVar12 * 0x10;
    uVar8 = 0xffffffffffffffff;
    if (-1 < iVar12) {
      uVar8 = lVar11 + 8;
    }
    plVar7 = (long *)operator_new__(uVar8,(nothrow_t *)&std::nothrow);
    if (plVar7 == (long *)0x0) {
      bVar6 = false;
    }
    else {
      *plVar7 = (long)iVar12;
      pSVar1 = (SimpleTag *)(plVar7 + 1);
      lVar10 = 0;
      pSVar13 = pSVar1;
      do {
        SimpleTag::SimpleTag(pSVar13);
        lVar10 = lVar10 + -0x10;
        pSVar13 = pSVar13 + 1;
      } while (-lVar10 != lVar11);
      pSVar13 = this->m_simple_tags;
      uVar9 = 0;
      uVar8 = (ulong)(uint)this->m_simple_tags_count;
      if (this->m_simple_tags_count < 1) {
        uVar8 = uVar9;
      }
      for (; uVar8 * 0x10 != uVar9; uVar9 = uVar9 + 0x10) {
        puVar2 = (undefined8 *)((long)&pSVar13->m_tag_name + uVar9);
        uVar5 = puVar2[1];
        puVar3 = (undefined8 *)((long)&pSVar1->m_tag_name + uVar9);
        *puVar3 = *puVar2;
        puVar3[1] = uVar5;
      }
      if (pSVar13 != (SimpleTag *)0x0) {
        if (pSVar13[-1].m_tag_string != (char *)0x0) {
          lVar11 = (long)pSVar13[-1].m_tag_string << 4;
          do {
            SimpleTag::~SimpleTag((SimpleTag *)((long)&pSVar13[-1].m_tag_name + lVar11));
            lVar11 = lVar11 + -0x10;
          } while (lVar11 != 0);
        }
        operator_delete__(&pSVar13[-1].m_tag_string);
      }
      this->m_simple_tags = pSVar1;
      this->m_simple_tags_size = iVar12;
      bVar6 = true;
    }
  }
  return bVar6;
}

Assistant:

bool Tags::Tag::ExpandSimpleTagsArray() {
  if (m_simple_tags_size > m_simple_tags_count)
    return true;  // nothing else to do

  const int size = (m_simple_tags_size == 0) ? 1 : 2 * m_simple_tags_size;

  SimpleTag* const displays = new (std::nothrow) SimpleTag[size];

  if (displays == NULL)
    return false;

  for (int idx = 0; idx < m_simple_tags_count; ++idx) {
    m_simple_tags[idx].ShallowCopy(displays[idx]);
  }

  delete[] m_simple_tags;
  m_simple_tags = displays;

  m_simple_tags_size = size;
  return true;
}